

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dotlockUnlock(sqlite3_file *id,int eFileLock)

{
  int iVar1;
  int *piVar2;
  int local_34;
  int tErrno;
  int rc;
  char *zLockFile;
  unixFile *pFile;
  int eFileLock_local;
  sqlite3_file *id_local;
  
  if ((uint)*(byte *)((long)&id[3].pMethods + 4) == eFileLock) {
    id_local._4_4_ = 0;
  }
  else if (eFileLock == 1) {
    *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
    id_local._4_4_ = 0;
  }
  else {
    iVar1 = (*aSyscall[0x13].pCurrent)(id[5].pMethods);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 2) {
        local_34 = 0;
      }
      else {
        local_34 = 0x80a;
        storeLastErrno((unixFile *)id,*piVar2);
      }
      id_local._4_4_ = local_34;
    }
    else {
      *(undefined1 *)((long)&id[3].pMethods + 4) = 0;
      id_local._4_4_ = 0;
    }
  }
  return id_local._4_4_;
}

Assistant:

static int dotlockUnlock(sqlite3_file *id, int eFileLock) {
  unixFile *pFile = (unixFile*)id;
  char *zLockFile = (char *)pFile->lockingContext;
  int rc;

  assert( pFile );
  OSTRACE(("UNLOCK  %d %d was %d pid=%d (dotlock)\n", pFile->h, eFileLock,
           pFile->eFileLock, osGetpid(0)));
  assert( eFileLock<=SHARED_LOCK );
  
  /* no-op if possible */
  if( pFile->eFileLock==eFileLock ){
    return SQLITE_OK;
  }

  /* To downgrade to shared, simply update our internal notion of the
  ** lock state.  No need to mess with the file on disk.
  */
  if( eFileLock==SHARED_LOCK ){
    pFile->eFileLock = SHARED_LOCK;
    return SQLITE_OK;
  }
  
  /* To fully unlock the database, delete the lock file */
  assert( eFileLock==NO_LOCK );
  rc = osRmdir(zLockFile);
  if( rc<0 ){
    int tErrno = errno;
    if( tErrno==ENOENT ){
      rc = SQLITE_OK;
    }else{
      rc = SQLITE_IOERR_UNLOCK;
      storeLastErrno(pFile, tErrno);
    }
    return rc; 
  }
  pFile->eFileLock = NO_LOCK;
  return SQLITE_OK;
}